

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O1

bool __thiscall
helics::TimeDependencies::checkIfAllDependenciesArePastExec(TimeDependencies *this,bool iterating)

{
  TimeState TVar1;
  pointer pDVar2;
  pointer pDVar3;
  pointer pDVar4;
  pointer pDVar5;
  pointer pDVar6;
  TimeState TVar7;
  long lVar8;
  
  TVar7 = !iterating * '\x02' + time_requested_require_iteration;
  pDVar3 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pDVar2 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar8 = ((long)pDVar2 - (long)pDVar3 >> 3) * 0x2e8ba2e8ba2e8ba3 >> 2;
  pDVar4 = pDVar3;
  if (0 < lVar8) {
    pDVar4 = pDVar3 + lVar8 * 4;
    lVar8 = lVar8 + 1;
    pDVar5 = pDVar3 + 2;
    do {
      if (((pDVar5[-2].dependency == true) && (pDVar5[-2].connection != SELF)) &&
         (TVar1 = pDVar5[-2].super_TimeData.mTimeState, TVar1 < TVar7)) {
        if (TVar1 != time_granted) {
          pDVar6 = pDVar5 + -2;
          goto LAB_00309871;
        }
        pDVar6 = pDVar3;
        if (pDVar5[-2].super_TimeData.next.internalTimeCode < 1) goto LAB_00309871;
      }
      if (((pDVar5[-1].dependency == true) && (pDVar5[-1].connection != SELF)) &&
         (TVar1 = pDVar5[-1].super_TimeData.mTimeState, TVar1 < TVar7)) {
        if (TVar1 != time_granted) {
          pDVar6 = pDVar3 + 1;
          goto LAB_00309871;
        }
        if (pDVar5[-1].super_TimeData.next.internalTimeCode < 1) {
          pDVar6 = pDVar5 + -1;
          goto LAB_00309871;
        }
      }
      if (((pDVar5->dependency == true) && (pDVar5->connection != SELF)) &&
         (TVar1 = (pDVar5->super_TimeData).mTimeState, TVar1 < TVar7)) {
        pDVar6 = pDVar5;
        if (TVar1 != time_granted) goto LAB_00309871;
        if ((pDVar5->super_TimeData).next.internalTimeCode < 1) {
          pDVar6 = pDVar3 + 2;
          goto LAB_00309871;
        }
      }
      if (((pDVar5[1].dependency == true) && (pDVar5[1].connection != SELF)) &&
         (TVar1 = pDVar5[1].super_TimeData.mTimeState, TVar1 < TVar7)) {
        if (TVar1 != time_granted) {
          pDVar6 = pDVar3 + 3;
          goto LAB_00309871;
        }
        if (pDVar5[1].super_TimeData.next.internalTimeCode < 1) {
          pDVar6 = pDVar5 + 1;
          goto LAB_00309871;
        }
      }
      pDVar3 = pDVar3 + 4;
      lVar8 = lVar8 + -1;
      pDVar5 = pDVar5 + 4;
    } while (1 < lVar8);
  }
  lVar8 = ((long)pDVar2 - (long)pDVar4 >> 3) * 0x2e8ba2e8ba2e8ba3;
  if (lVar8 != 1) {
    if (lVar8 != 2) {
      pDVar6 = pDVar2;
      if ((lVar8 != 3) ||
         (((pDVar4->dependency == true && (pDVar4->connection != SELF)) &&
          ((TVar1 = (pDVar4->super_TimeData).mTimeState, TVar1 < TVar7 &&
           ((pDVar6 = pDVar4, TVar1 != time_granted ||
            ((pDVar4->super_TimeData).next.internalTimeCode < 1)))))))) goto LAB_00309871;
      pDVar4 = pDVar4 + 1;
    }
    if ((((pDVar4->dependency == true) && (pDVar4->connection != SELF)) &&
        (TVar1 = (pDVar4->super_TimeData).mTimeState, TVar1 < TVar7)) &&
       ((pDVar6 = pDVar4, TVar1 != time_granted ||
        ((pDVar4->super_TimeData).next.internalTimeCode < 1)))) goto LAB_00309871;
    pDVar4 = pDVar4 + 1;
  }
  pDVar6 = pDVar2;
  if (((pDVar4->dependency == true) && (pDVar4->connection != SELF)) &&
     ((TVar1 = (pDVar4->super_TimeData).mTimeState, TVar1 < TVar7 &&
      ((pDVar6 = pDVar4, TVar1 == time_granted &&
       (0 < (pDVar4->super_TimeData).next.internalTimeCode)))))) {
    pDVar6 = pDVar2;
  }
LAB_00309871:
  return pDVar6 == pDVar2;
}

Assistant:

bool TimeDependencies::checkIfAllDependenciesArePastExec(bool iterating) const
{
    auto minstate =
        iterating ? TimeState::time_requested_require_iteration : TimeState::time_requested;

    return std::all_of(dependencies.begin(), dependencies.end(), [minstate](const auto& dep) {
        return ((!dep.dependency) || (dep.connection == ConnectionType::SELF) ||
                (dep.mTimeState >= minstate) ||
                (dep.mTimeState == TimeState::time_granted && dep.next > timeZero));
    });

    /* return std::none_of(dependencies.begin(), dependencies.end(), [minstate](const auto& dep) {
         return (dep.dependency && dep.connection != ConnectionType::SELF &&
                 (dep.mTimeState < minstate));
     });*/
}